

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void adjustOrderByCol(ExprList *pOrderBy,ExprList *pEList)

{
  u16 uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  anon_union_4_2_6146edf4_for_u *paVar5;
  ulong uVar6;
  anon_union_4_2_6146edf4_for_u *paVar7;
  
  if (pOrderBy != (ExprList *)0x0) {
    uVar2 = (ulong)(uint)pOrderBy->nExpr;
    if (pOrderBy->nExpr < 1) {
      uVar2 = 0;
    }
    for (uVar4 = 0; uVar4 != uVar2; uVar4 = uVar4 + 1) {
      uVar1 = pOrderBy->a[uVar4].u.x.iOrderByCol;
      if (uVar1 != 0) {
        paVar5 = &pOrderBy->a[uVar4].u;
        uVar6 = (ulong)(uint)pEList->nExpr;
        if (pEList->nExpr < 1) {
          uVar6 = 0;
        }
        paVar7 = &pEList->a[0].u;
        for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
          if ((paVar7->x).iOrderByCol == uVar1) {
            (paVar5->x).iOrderByCol = (short)uVar3 + 1;
            if ((int)uVar3 < pEList->nExpr) goto LAB_0018fa39;
            break;
          }
          paVar7 = paVar7 + 6;
        }
        (paVar5->x).iOrderByCol = 0;
      }
LAB_0018fa39:
    }
  }
  return;
}

Assistant:

static void adjustOrderByCol(ExprList *pOrderBy, ExprList *pEList){
  int i, j;
  if( pOrderBy==0 ) return;
  for(i=0; i<pOrderBy->nExpr; i++){
    int t = pOrderBy->a[i].u.x.iOrderByCol;
    if( t==0 ) continue;
    for(j=0; j<pEList->nExpr; j++){
      if( pEList->a[j].u.x.iOrderByCol==t ){
        pOrderBy->a[i].u.x.iOrderByCol = j+1;
        break;
      }
    }
    if( j>=pEList->nExpr ){
      pOrderBy->a[i].u.x.iOrderByCol = 0;
    }
  }
}